

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bar.c
# Opt level: O1

void Bar_ProgressShow(Bar_Progress_t *p,char *pString)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  int __c;
  
  if (p != (Bar_Progress_t *)0x0) {
    sVar2 = 0;
    iVar1 = Abc_FrameIsBatchMode();
    if (iVar1 == 0) {
      if (pString == (char *)0x0) goto LAB_00448b0a;
      fprintf((FILE *)p->pFile,"%s ",pString);
      sVar2 = strlen(pString);
      while( true ) {
        sVar2 = (size_t)((int)sVar2 + 1);
LAB_00448b0a:
        iVar1 = (int)sVar2;
        if (p->posCur <= iVar1) break;
        fputc(0x2d,(FILE *)p->pFile);
      }
      if (iVar1 != p->posCur) goto LAB_00448b33;
      __stream = (FILE *)p->pFile;
      __c = 0x3e;
      while( true ) {
        iVar1 = (int)sVar2;
        fputc(__c,__stream);
LAB_00448b33:
        if (p->posTotal <= iVar1) break;
        sVar2 = (size_t)(iVar1 + 1);
        __stream = (FILE *)p->pFile;
        __c = 0x20;
      }
      fputc(0xd,(FILE *)p->pFile);
      fflush(_stdout);
      return;
    }
  }
  return;
}

Assistant:

void Bar_ProgressShow( Bar_Progress_t * p, char * pString )
{
    int i;
    if ( p == NULL ) 
        return;
    if ( Abc_FrameIsBatchMode() )
        return;
    if ( pString )
        fprintf( p->pFile, "%s ", pString );
    for ( i = (pString? strlen(pString) + 1 : 0); i < p->posCur; i++ )
        fprintf( p->pFile, "-" );
    if ( i == p->posCur )
        fprintf( p->pFile, ">" );
    for ( i++  ; i <= p->posTotal; i++ )
        fprintf( p->pFile, " " );
    fprintf( p->pFile, "\r" );
    fflush( stdout );
}